

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_127a7::TestCheckArrayCloseTrue::RunImpl(TestCheckArrayCloseTrue *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  float local_88;
  int local_84;
  TestDetails local_80;
  float array2 [3];
  float array1 [3];
  TestResults results;
  
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  array1[0] = 1.0;
  array1[1] = 1.5;
  array1[2] = 2.0;
  array2[0] = 1.01;
  array2[1] = 1.51;
  array2[2] = 2.01;
  local_88 = 0.02;
  UnitTest::TestDetails::TestDetails(&local_80,"","","",0);
  UnitTest::CheckArrayClose<float[3],float[3],float>(&results,&array1,&array2,3,&local_88,&local_80)
  ;
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_88 = 0.0;
  local_84 = UnitTest::TestResults::GetFailureCount(&results);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_80,*ppTVar2,0xd2);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&local_88,&local_84,&local_80);
  return;
}

Assistant:

TEST(CheckArrayCloseTrue)
{
    TestResults results;

    float const array1[3] = { 1.0f, 1.5f, 2.0f };
    float const array2[3] = { 1.01f, 1.51f, 2.01f };
    CheckArrayClose(results, array1, array2, 3, 0.02f, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}